

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::remap_graphics_pipeline_ci
          (Impl *this,VkGraphicsPipelineCreateInfo *info)

{
  bool bVar1;
  VkPipelineLibraryCreateInfoKHR *pVVar2;
  uint local_2c;
  uint32_t i;
  VkPipelineLibraryCreateInfoKHR *library;
  VkGraphicsPipelineCreateInfo *info_local;
  Impl *this_local;
  
  bVar1 = remap_render_pass_handle(this,info->renderPass,&info->renderPass);
  if (bVar1) {
    bVar1 = remap_pipeline_layout_handle(this,info->layout,&info->layout);
    if (bVar1) {
      pVVar2 = find_pnext<VkPipelineLibraryCreateInfoKHR>
                         (VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR,info->pNext);
      if (pVVar2 != (VkPipelineLibraryCreateInfoKHR *)0x0) {
        for (local_2c = 0; local_2c < pVVar2->libraryCount; local_2c = local_2c + 1) {
          bVar1 = remap_graphics_pipeline_handle
                            (this,pVVar2->pLibraries[local_2c],pVVar2->pLibraries + local_2c);
          if (!bVar1) {
            return false;
          }
        }
      }
      if ((info->basePipelineHandle == (VkPipeline)0x0) ||
         (bVar1 = remap_graphics_pipeline_handle
                            (this,info->basePipelineHandle,&info->basePipelineHandle), bVar1)) {
        bVar1 = remap_shader_module_handles<VkGraphicsPipelineCreateInfo>(this,info);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::Impl::remap_graphics_pipeline_ci(VkGraphicsPipelineCreateInfo *info)
{
	if (!remap_render_pass_handle(info->renderPass, &info->renderPass))
		return false;
	if (!remap_pipeline_layout_handle(info->layout, &info->layout))
		return false;

	auto *library = find_pnext<VkPipelineLibraryCreateInfoKHR>(
			VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR, info->pNext);

	if (library)
	{
		for (uint32_t i = 0; i < library->libraryCount; i++)
			if (!remap_graphics_pipeline_handle(library->pLibraries[i], const_cast<VkPipeline *>(&library->pLibraries[i])))
				return false;
	}

	if (info->basePipelineHandle != VK_NULL_HANDLE)
		if (!remap_graphics_pipeline_handle(info->basePipelineHandle, &info->basePipelineHandle))
			return false;

	if (!remap_shader_module_handles(info))
		return false;

	return true;
}